

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOWriteFmsMetaData(FmsIOContext *ctx,FmsIOFunctions *io,char *key,FmsMetaData mdata)

{
  int iVar1;
  char *__ptr;
  FmsMetaData in_RCX;
  FmsIOFunctions *in_RDX;
  FmsIOContext *in_RSI;
  undefined8 in_RDI;
  char *tk;
  char temp [20];
  FmsMetaData *data_3;
  FmsInt size_2;
  FmsInt i;
  char *mdata_name_3;
  char *ksize;
  char *kdata_3;
  char *kname_3;
  char *data_2;
  char *mdata_name_2;
  char *kdata_2;
  char *kname_2;
  void *data_1;
  FmsInt size_1;
  FmsScalarType scalar_type;
  char *mdata_name_1;
  char *kdata_1;
  char *kname_1;
  void *data;
  FmsInt size;
  FmsIntType int_type;
  char *mdata_name;
  char *kdata;
  char *kname;
  char *kmdtype;
  int r;
  FmsMetaDataType type;
  int err;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  FmsMetaData *local_f8;
  FmsInt local_f0;
  ulong local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  void *local_a0;
  FmsInt local_98;
  FmsScalarType local_8c;
  char *local_88;
  char *local_80;
  char *local_78;
  void *local_70;
  FmsInt local_68;
  FmsIntType local_5c;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  int local_34;
  FmsMetaDataType in_stack_ffffffffffffffd0;
  int local_4;
  
  local_34 = FmsMetaDataGetType(in_RCX,(FmsMetaDataType *)&stack0xffffffffffffffd0);
  if (local_34 < 2) {
    if (local_34 == 1) {
      local_4 = 0;
    }
    else {
      local_40 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      (*(code *)in_RSI[2].fp)(in_RDI,local_40,FmsMetaDataTypeNames[in_stack_ffffffffffffffd0]);
      if (local_40 != (char *)0x0) {
        free(local_40);
      }
      switch(in_stack_ffffffffffffffd0) {
      case FMS_INTEGER:
        local_48 = (char *)0x0;
        local_50 = (char *)0x0;
        local_58 = (char *)0x0;
        local_70 = (void *)0x0;
        iVar1 = FmsMetaDataGetIntegers(in_RCX,&local_58,&local_5c,&local_68,&local_70);
        if (iVar1 != 0) {
          return 3;
        }
        local_48 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        iVar1 = (*(code *)in_RSI[2].fp)(in_RDI,local_48,local_58);
        if (local_48 != (char *)0x0) {
          free(local_48);
        }
        if (iVar1 != 0) {
          return 4;
        }
        local_50 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        iVar1 = (*(code *)in_RSI[1].fp)(in_RDI,local_50,local_5c,local_70,local_68);
        if (local_50 != (char *)0x0) {
          free(local_50);
        }
        if (iVar1 != 0) {
          return 5;
        }
        break;
      case FMS_SCALAR:
        local_78 = (char *)0x0;
        local_80 = (char *)0x0;
        local_88 = (char *)0x0;
        local_a0 = (void *)0x0;
        iVar1 = FmsMetaDataGetScalars(in_RCX,&local_88,&local_8c,&local_98,&local_a0);
        if (iVar1 != 0) {
          return 6;
        }
        local_78 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        iVar1 = (*(code *)in_RSI[2].fp)(in_RDI,local_78,local_88);
        if (local_78 != (char *)0x0) {
          free(local_78);
        }
        if (iVar1 != 0) {
          return 7;
        }
        local_80 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        iVar1 = (*(code *)in_RSI[1].temp_strings)(in_RDI,local_80,local_8c,local_a0,local_98);
        if (local_80 != (char *)0x0) {
          free(local_80);
        }
        if (iVar1 != 0) {
          return 8;
        }
        break;
      case FMS_STRING:
        local_a8 = (char *)0x0;
        local_b0 = (char *)0x0;
        local_b8 = (char *)0x0;
        local_c0 = (char *)0x0;
        iVar1 = FmsMetaDataGetString(in_RCX,&local_b8,&local_c0);
        if (iVar1 != 0) {
          return 9;
        }
        local_a8 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        iVar1 = (*(code *)in_RSI[2].fp)(in_RDI,local_a8,local_b8);
        if (local_a8 != (char *)0x0) {
          free(local_a8);
        }
        if (iVar1 != 0) {
          return 10;
        }
        local_b0 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        iVar1 = (*(code *)in_RSI[2].fp)(in_RDI,local_b0,local_c0);
        if (local_b0 != (char *)0x0) {
          free(local_b0);
        }
        if (iVar1 != 0) {
          return 0xb;
        }
        break;
      case FMS_META_DATA:
        local_c8 = (char *)0x0;
        local_d0 = (char *)0x0;
        local_d8 = (char *)0x0;
        local_e0 = (char *)0x0;
        local_f0 = 0;
        local_f8 = (FmsMetaData *)0x0;
        iVar1 = FmsMetaDataGetMetaData(in_RCX,&local_e0,&local_f0,&local_f8);
        if (iVar1 != 0) {
          return 0xc;
        }
        if (local_f8 == (FmsMetaData *)0x0) {
          return 0xd;
        }
        local_c8 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        iVar1 = (*(code *)in_RSI[2].fp)(in_RDI,local_c8,local_e0);
        if (local_c8 != (char *)0x0) {
          free(local_c8);
        }
        if (iVar1 != 0) {
          return 0xe;
        }
        local_d8 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        iVar1 = (*(code *)in_RSI->temp_strings_cap)(in_RDI,local_d8,local_f0);
        if (local_d8 != (char *)0x0) {
          free(local_d8);
        }
        if (iVar1 != 0) {
          return 0xf;
        }
        local_d0 = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        for (local_e8 = 0; local_e8 < local_f0; local_e8 = local_e8 + 1) {
          sprintf(&stack0xfffffffffffffee8,"%d",local_e8 & 0xffffffff);
          __ptr = join_keys(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          iVar1 = FmsIOWriteFmsMetaData
                            (in_RSI,in_RDX,(char *)in_RCX,
                             (FmsMetaData)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
          if (__ptr != (char *)0x0) {
            free(__ptr);
          }
          if (iVar1 != 0) {
            if (local_d0 != (char *)0x0) {
              free(local_d0);
            }
            return 0x10;
          }
          iVar1 = 0;
        }
        if (local_d0 != (char *)0x0) {
          free(local_d0);
        }
        break;
      default:
        return 0x11;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
FmsIOWriteFmsMetaData(FmsIOContext *ctx, FmsIOFunctions *io, const char *key,
                      FmsMetaData mdata) {
  int err = 0;
  FmsMetaDataType type;

  /* It says it returns 1 if mdata is empty, but then just checks if its null (if im not mistaken).
      We already null checked before we got here so I'm not sure if we need to check for 1. */
  int r = FmsMetaDataGetType(mdata, &type);
  if(r > 1)
    E_RETURN(1);
  else if(r == 1)
    return 0;

  char *kmdtype = join_keys(key, "MetaDataType");
  (*io->add_string)(ctx, kmdtype, FmsMetaDataTypeNames[type]);
  FREE(kmdtype);

  switch(type) {
  case FMS_INTEGER: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    FmsIntType int_type;
    FmsInt size;
    const void *data = NULL;

    if(FmsMetaDataGetIntegers(mdata, &mdata_name, &int_type, &size, &data))
      E_RETURN(3);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(4); }

    kdata = join_keys(key, "Data");
    err = (*io->add_typed_int_array)(ctx, kdata, int_type, data, size);
    FREE(kdata);
    if (err) { E_RETURN(5); }
    break;
  }
  case FMS_SCALAR: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    FmsScalarType scalar_type;
    FmsInt size;
    const void *data = NULL;

    if(FmsMetaDataGetScalars(mdata, &mdata_name, &scalar_type, &size, &data))
      E_RETURN(6);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(7); }

    kdata = join_keys(key, "Data");
    err = (*io->add_scalar_array)(ctx, kdata, scalar_type, data, size);
    FREE(kdata);
    if (err) { E_RETURN(8); }
    break;
  }
  case FMS_STRING: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    const char *data = NULL;

    if(FmsMetaDataGetString(mdata, &mdata_name, &data))
      E_RETURN(9);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(10); }

    kdata = join_keys(key, "Data");
    err = (*io->add_string)(ctx, kdata, data);
    FREE(kdata);
    if (err) { E_RETURN(11); }
    break;
  }
  case FMS_META_DATA: {
    char *kname = NULL, *kdata = NULL, *ksize = NULL;
    const char *mdata_name = NULL;
    FmsInt i, size = 0;
    FmsMetaData *data = NULL;

    if(FmsMetaDataGetMetaData(mdata, &mdata_name, &size, &data))
      E_RETURN(12);

    if (!data) { E_RETURN(13); }

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(14); }

    ksize = join_keys(key, "Size");
    err = (*io->add_int)(ctx, ksize, size);
    FREE(ksize);
    if (err) { E_RETURN(15); }

    kdata = join_keys(key, "Data");
    // Recursive?
    for(i = 0; i < size; i++) {
      char temp[20], *tk = NULL;
      sprintf(temp, "%d", (int)i);
      tk = join_keys(kdata, temp);
      err = FmsIOWriteFmsMetaData(ctx, io, tk, data[i]);
      FREE(tk);
      if (err) {
        FREE(kdata);
        E_RETURN(16);
      }
    }
    FREE(kdata);
    break;
  }
  default:
    E_RETURN(17);
    break;
  }
  return 0;
}